

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O1

int count_dups<int>(vector<int,_std::allocator<int>_> *t)

{
  int iVar1;
  pointer piVar2;
  long lVar3;
  ulong uVar4;
  undefined1 *puVar5;
  pointer piVar6;
  undefined1 *__s;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  undefined8 uStack_30;
  
  piVar2 = (t->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar4 = (long)(t->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_finish - (long)piVar2;
  lVar10 = (long)uVar4 >> 2;
  lVar3 = -(lVar10 + 0xfU & 0xfffffffffffffff0);
  __s = &stack0xffffffffffffffd8 + lVar3;
  iVar12 = 0;
  *(undefined8 *)((long)&uStack_30 + lVar3) = 0x10b88b;
  memset(__s,0,(long)(int)(uVar4 >> 2));
  uVar9 = (uint)lVar10;
  if (0 < (int)uVar9) {
    uVar11 = (ulong)(uVar9 & 0x7fffffff);
    iVar12 = 0;
    uVar8 = 0;
    puVar5 = __s;
    piVar6 = piVar2;
    uVar4 = uVar11;
    do {
      uVar4 = uVar4 - 1;
      piVar6 = piVar6 + 1;
      puVar5 = puVar5 + 1;
      uVar7 = uVar8 + 1;
      if ((__s[uVar8] == '\0') && (uVar7 < uVar11)) {
        iVar1 = piVar2[uVar8];
        uVar8 = 0;
        do {
          if (iVar1 == piVar6[uVar8]) {
            iVar12 = iVar12 + 1;
            puVar5[uVar8] = 1;
          }
          uVar8 = uVar8 + 1;
        } while (uVar4 != uVar8);
      }
      uVar8 = uVar7;
    } while (uVar7 != uVar11);
  }
  return iVar12;
}

Assistant:

int count_dups(std::vector<T> &t)
{
    int dups = 0;
    int N = t.size();
    STACKALLOC(bool, mark, t.size());
    memset(mark, 0, N);
    for(int i=0; i<N; ++i) {
        if(mark[i])
            continue;
        for(int j=i+1; j<N; ++j) {
            if(t[i] == t[j]) {
                dups++;
                mark[j] = true;
            }
        }
    }
    return dups;
}